

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O2

void __thiscall muduo::Thread::setDefaultName(Thread *this)

{
  int iVar1;
  char buf [32];
  
  iVar1 = numCreated_;
  LOCK();
  numCreated_ = numCreated_ + 1;
  UNLOCK();
  if ((this->name_)._M_string_length != 0) {
    return;
  }
  snprintf(buf,0x20,"Thread%d",(ulong)(iVar1 + 1));
  std::__cxx11::string::assign((char *)&this->name_);
  return;
}

Assistant:

void Thread::setDefaultName()
{
  int num = numCreated_.incrementAndGet();
  if (name_.empty())
  {
    char buf[32];
    snprintf(buf, sizeof buf, "Thread%d", num);
    name_ = buf;
  }
}